

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O2

int __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::remove
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,char *__filename)

{
  TermList **ppTVar1;
  uint uVar2;
  IntermediateNode *pIVar3;
  uint64_t uVar4;
  TermList *pTVar5;
  ulong uVar6;
  Node *pNVar7;
  Node ***pppNVar8;
  int iVar9;
  int extraout_EAX;
  TermList *pTVar10;
  Node **inode;
  ulong uVar11;
  SelectedSummand *in_RDX;
  Node *node;
  Top TVar12;
  TermList t;
  Stack<Kernel::TermList_*> subterms;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  history;
  TermList local_d0;
  Stack<Kernel::TermList_*> local_c8;
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_a8;
  SelectedSummand *local_98;
  SelectedSummand local_90;
  SelectedSummand local_60;
  undefined4 extraout_var;
  
  inode = &this->_root;
  local_98 = in_RDX;
  Lib::
  Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_a8);
  while( true ) {
    iVar9 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[2])();
    if ((char)iVar9 != '\0') break;
    Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>::
    push((Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**> *)
         local_a8._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_false>
         ._M_head_impl,inode);
    pIVar3 = (IntermediateNode *)*inode;
    pTVar10 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                        ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                          *)__filename,pIVar3->childVar);
    local_d0._content = pTVar10->_content;
    TVar12 = Kernel::TermList::top(&local_d0);
    iVar9 = (*(pIVar3->super_Node)._vptr_Node[10])
                      (pIVar3,TVar12._inner._inner._0_8_,(ulong)(TVar12._inner._inner._8_4_ & 0xff),
                       0);
    inode = (Node **)CONCAT44(extraout_var,iVar9);
    uVar4 = (((IntermediateNode *)*inode)->super_Node)._term._content;
    if (uVar4 != local_d0._content) {
      uVar2 = *(uint *)(uVar4 + 0xc);
      local_c8._capacity = 0x78;
      local_c8._stack = (TermList **)Lib::alloc(0x3c0);
      local_c8._end = local_c8._stack + local_c8._capacity;
      local_c8._cursor = local_c8._stack;
      Lib::Stack<Kernel::TermList_*>::push
                (&local_c8,(TermList *)(uVar4 + (ulong)(uVar2 & 0xfffffff) * 8 + 0x28));
      Lib::Stack<Kernel::TermList_*>::push
                (&local_c8,
                 (TermList *)
                 (local_d0._content + (ulong)(*(uint *)(local_d0._content + 0xc) & 0xfffffff) * 8 +
                 0x28));
      while (local_c8._cursor != local_c8._stack) {
        pTVar10 = local_c8._cursor[-1];
        ppTVar1 = local_c8._cursor + -2;
        pTVar5 = local_c8._cursor[-2];
        local_c8._cursor = ppTVar1;
        if ((pTVar10[-1]._content & 3) != 2) {
          Lib::Stack<Kernel::TermList_*>::push(&local_c8,pTVar5 + -1);
          Lib::Stack<Kernel::TermList_*>::push(&local_c8,pTVar10 + -1);
        }
        uVar6 = pTVar5->_content;
        if (uVar6 != pTVar10->_content) {
          if ((uVar6 & 1) == 0) {
            uVar11 = (ulong)(*(uint *)(uVar6 + 0xc) & 0xfffffff);
            if ((*(uint *)(uVar6 + 0x28 + uVar11 * 8) & 3) != 2) {
              Lib::Stack<Kernel::TermList_*>::push
                        (&local_c8,(TermList *)(uVar6 + uVar11 * 8 + 0x28));
              Lib::Stack<Kernel::TermList_*>::push
                        (&local_c8,
                         (TermList *)
                         (pTVar10->_content +
                          (ulong)(*(uint *)(pTVar10->_content + 0xc) & 0xfffffff) * 8 + 0x28));
            }
          }
          else {
            Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                      ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *
                       )__filename,(uint)(uVar6 >> 2),(TermList)pTVar10->_content);
          }
        }
      }
      Lib::Stack<Kernel::TermList_*>::~Stack(&local_c8);
    }
  }
  pIVar3 = (IntermediateNode *)*inode;
  Kernel::SelectedSummand::SelectedSummand(&local_90,local_98);
  Kernel::SelectedSummand::SelectedSummand(&local_60,&local_90);
  (*(pIVar3->super_Node)._vptr_Node[10])(pIVar3,&local_60);
  ensureLeafEfficiency((Leaf **)inode);
  do {
    iVar9 = (*(((IntermediateNode *)*inode)->super_Node)._vptr_Node[3])();
    if ((char)iVar9 == '\0') {
LAB_002bf709:
      Lib::
      Recycled<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
      ::~Recycled(&local_a8);
      return extraout_EAX;
    }
    pIVar3 = (IntermediateNode *)*inode;
    local_c8._capacity = (pIVar3->super_Node)._term._content;
    if (*(Node ****)
         ((long)local_a8._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_false>
                ._M_head_impl + 0x10) ==
        *(Node ****)
         ((long)local_a8._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
                .
                super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_false>
                ._M_head_impl + 8)) {
      (*(pIVar3->super_Node)._vptr_Node[1])(pIVar3);
      *inode = (Node *)0x0;
      goto LAB_002bf709;
    }
    pNVar7 = *(*(Node ****)
                ((long)local_a8._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10))[-1];
    TVar12 = Kernel::TermList::top((TermList *)&local_c8);
    (*pNVar7->_vptr_Node[0xb])
              (pNVar7,TVar12._inner._inner._0_8_,(ulong)(TVar12._inner._inner._8_4_ & 0xff));
    (*(pIVar3->super_Node)._vptr_Node[1])(pIVar3);
    pppNVar8 = *(Node ****)
                ((long)local_a8._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
                       .
                       super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_false>
                       ._M_head_impl + 0x10);
    *(Node ****)
     ((long)local_a8._self._M_t.
            super___uniq_ptr_impl<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_std::default_delete<Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_>_>
            .
            super__Head_base<0UL,_Lib::Stack<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Node_**>_*,_false>
            ._M_head_impl + 0x10) = pppNVar8 + -1;
    inode = pppNVar8[-1];
    ensureIntermediateNodeEfficiency((IntermediateNode **)inode);
  } while( true );
}

Assistant:

void SubstitutionTree<LeafData_>::remove(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_REMOVE(0, "remove: ", svBindings, " from ", *this)

  ASS(*pnode);

  Recycled<Stack<Node**>> history;

  while (! (*pnode)->isLeaf()) {
    history->push(pnode);

    IntermediateNode* inode=static_cast<IntermediateNode*>(*pnode);

    unsigned boundVar=inode->childVar;
    TermList t = svBindings.get(boundVar);

    pnode=inode->childByTop(t.top(),false);
    ASS(pnode);


    TermList* s = &(*pnode)->term();
    ASS(TermList::sameTop(*s,t));

    if(*s==t) {
      continue;
    }

    ASS(! s->isVar());
    TermList* ss = s->term()->args();
    ASS(!ss->isEmpty());

    // computing the disagreement set of the two terms
    Stack<TermList*> subterms(120);

    subterms.push(ss);
    subterms.push(t.term()->args());
    while (! subterms.isEmpty()) {
      TermList* tt = subterms.pop();
      ss = subterms.pop();
      if (tt->next()->isEmpty()) {
	ASS(ss->next()->isEmpty());
      }
      else {
	subterms.push(ss->next());
	subterms.push(tt->next());
      }
      if (*ss==*tt) {
	continue;
      }
      if (ss->isVar()) {
	ASS(ss->isSpecialVar());
	svBindings.set(ss->var(),*tt);
	continue;
      }
      ASS(! tt->isVar());
      ASS(ss->term()->functor() == tt->term()->functor());
      ss = ss->term()->args();
      if (! ss->isEmpty()) {
	ASS(! tt->term()->args()->isEmpty());
	subterms.push(ss);
	subterms.push(tt->term()->args());
      }
    }
  }

  ASS ((*pnode)->isLeaf());


  Leaf* lnode = static_cast<Leaf*>(*pnode);
  lnode->remove(ld);
  ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));

  while( (*pnode)->isEmpty() ) {
    TermList term=(*pnode)->term();
    if(history->isEmpty()) {
      delete *pnode;
      *pnode=0;
      DEBUG_REMOVE(0, "out: ", *this);
      return;
    } else {
      Node* node=*pnode;
      IntermediateNode* parent=static_cast<IntermediateNode*>(*history->top());
      parent->remove(term.top());
      delete node;
      pnode = history->pop();
      ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pnode));
    }
  }
  DEBUG_REMOVE(0, "out: ", *this);
}